

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

void hexdumpbytes<unsigned_char_const*>(string *str,uchar *buf,size_t nLength,char sep)

{
  uint8_t b;
  char *local_30;
  char *p;
  size_t sStack_20;
  char sep_local;
  size_t nLength_local;
  uchar *buf_local;
  string *str_local;
  
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)str);
  std::__cxx11::string::size();
  local_30 = (char *)std::__cxx11::string::operator[]((ulong)str);
  sStack_20 = nLength;
  nLength_local = (size_t)buf;
  while (sStack_20 != 0) {
    *local_30 = sep;
    b = get8<unsigned_char_const*>((uchar *)nLength_local);
    byte2hexchars(b,local_30 + 1);
    local_30 = local_30 + 3;
    nLength_local = nLength_local + 1;
    sStack_20 = sStack_20 - 1;
  }
  return;
}

Assistant:

void hexdumpbytes(std::string &str, I buf, size_t nLength, char sep=' ')
{
    str.resize(str.size()+nLength*3);
    char *p= &str[str.size()-nLength*3];
    while(nLength--)
    {
        *p++ = sep;
        byte2hexchars(get8(buf), p); p+=2; buf++;
    }
}